

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::option_not_exists_exception::~option_not_exists_exception
          (option_not_exists_exception *this)

{
  OptionException::~OptionException((OptionException *)this);
  operator_delete(this);
  return;
}

Assistant:

explicit option_not_exists_exception(const std::string& option)
    : OptionParseException("Option " + LQUOTE + option + RQUOTE + " does not exist")
    {
    }